

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectModel.cpp
# Opt level: O0

string * __thiscall
Lodtalk::VMContext::getClassNameOfObject_abi_cxx11_
          (string *__return_storage_ptr__,VMContext *this,Oop object)

{
  bool bVar1;
  int classIndex_00;
  Class *clazz;
  string local_68;
  Class *local_48;
  Class *clazz_1;
  Metaclass *meta;
  Oop classOop;
  int classIndex;
  VMContext *this_local;
  Oop object_local;
  
  classOop = object;
  classIndex_00 = classIndexOf(object);
  clazz_1 = (Class *)getClassFromIndex(this,classIndex_00);
  meta = (Metaclass *)clazz_1;
  if ((uint)((ulong)*(undefined8 *)clazz_1 >> 0x2a) == 0xc) {
    bVar1 = Oop::isNil((Oop *)((long)clazz_1 + 0x40));
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"a Metaclass",(allocator *)((long)&clazz + 3));
      std::allocator<char>::~allocator((allocator<char> *)((long)&clazz + 3));
    }
    else {
      local_48 = (Class *)(clazz_1->subclasses).field_0.header;
      Class::getNameString_abi_cxx11_(&local_68,local_48);
      std::operator+(__return_storage_ptr__,&local_68," class");
      std::__cxx11::string::~string((string *)&local_68);
    }
  }
  else {
    Class::getNameString_abi_cxx11_(__return_storage_ptr__,clazz_1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VMContext::getClassNameOfObject(Oop object)
{
	auto classIndex = classIndexOf(object);
	auto classOop = getClassFromIndex(classIndex);
	if(classOop.header->classIndex == SCI_Metaclass)
    {
        auto meta = reinterpret_cast<Metaclass*> (classOop.pointer);
        if(!meta->thisClass.isNil())
        {
            auto clazz = reinterpret_cast<Class*> (meta->thisClass.pointer);
    		return clazz->getNameString() + " class";
        }

        return "a Metaclass";
    }

	auto clazz = reinterpret_cast<Class*> (classOop.pointer);
	return clazz->getNameString();
}